

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

word Gia_LutComputeTruth6Simple(Gia_Man_t *p,int iPo)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  word local_38;
  word Truth;
  Gia_Obj_t *pObj;
  int iPo_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManPo(p,iPo);
  iVar1 = Gia_ObjFaninId0p(p,pObj_00);
  local_38 = Gia_LutComputeTruth6Simple_rec(p,iVar1);
  iVar1 = Gia_ObjFaninC0(pObj_00);
  if (iVar1 != 0) {
    local_38 = local_38 ^ 0xffffffffffffffff;
  }
  return local_38;
}

Assistant:

word Gia_LutComputeTruth6Simple( Gia_Man_t * p, int iPo )
{
    Gia_Obj_t * pObj = Gia_ManPo( p, iPo );
    word Truth = Gia_LutComputeTruth6Simple_rec( p, Gia_ObjFaninId0p(p, pObj) );
    return Gia_ObjFaninC0(pObj) ? ~Truth : Truth;
}